

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogComboBox::showPopup(QFileDialogComboBox *this)

{
  QFileSystemModel *pQVar1;
  QUrl *pQVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  QAbstractItemModel *pQVar7;
  QAbstractItemModel *pQVar8;
  long *plVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QUrl url;
  QUrl path;
  QUrl local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  QArrayDataPointer<QUrl> local_b8;
  undefined8 local_98;
  char16_t *pcStack_90;
  long *local_88;
  QArrayDataPointer<QUrl> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QComboBox::model(&this->super_QComboBox);
  local_58._forAlignment = -NAN;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  iVar4 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7);
  if (1 < iVar4) {
    QComboBox::showPopup(&this->super_QComboBox);
  }
  local_58._16_8_ = (long *)0x0;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = (char16_t *)0x0;
  QUrlModel::setUrls(this->urlModel,(QList<QUrl> *)&local_58);
  QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QUrl *)0x0;
  local_88 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_90 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->d_ptr->model;
  if (pQVar1 == (QFileSystemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = L"/";
    local_58._16_8_ = (long *)0x1;
  }
  else {
    QFileSystemModel::rootPath();
  }
  QFileSystemModel::index((QString *)&local_98,(int)pQVar1);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  if (local_88 != (long *)0x0 && -1 < (int)(local_98._4_4_ | (uint)local_98)) {
    do {
      local_d0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*local_88 + 0x90))(&local_58,local_88,&local_98,0x101);
      ::QVariant::toString();
      QUrl::fromLocalFile((QString *)&local_d0);
      if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d)->super_QArrayData,2,0x10);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      cVar3 = QUrl::isValid();
      if (cVar3 != '\0') {
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
                  ((QMovableArrayOps<QUrl> *)&local_78,local_78.size,&local_d0);
        QList<QUrl>::end((QList<QUrl> *)&local_78);
      }
      if (local_88 == (long *)0x0) {
        local_58._forAlignment = -NAN;
        local_58._8_8_ = (char16_t *)0x0;
        local_58._16_8_ = (long *)0x0;
      }
      else {
        (**(code **)(*local_88 + 0x68))(&local_58,local_88,&local_98);
      }
      local_88 = (long *)local_58._16_8_;
      local_98 = (QArrayData *)local_58.shared;
      pcStack_90 = (char16_t *)local_58._8_8_;
      QUrl::~QUrl(&local_d0);
    } while (((-1 < (int)(uint)local_98) && (-1 < (long)local_98)) && (local_88 != (long *)0x0));
  }
  QVar14.m_data = (storage_type *)0x5;
  QVar14.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar14);
  local_b8.d = (Data *)local_58.shared;
  local_b8.ptr = (QUrl *)local_58._8_8_;
  local_b8.size = local_58._16_8_;
  QUrl::QUrl((QUrl *)&local_58.shared,(QString *)&local_b8,TolerantMode);
  QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
            ((QMovableArrayOps<QUrl> *)&local_78,local_78.size,(QUrl *)&local_58.shared);
  QList<QUrl>::end((QList<QUrl> *)&local_78);
  QUrl::~QUrl((QUrl *)&local_58.shared);
  if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d)->super_QArrayData,2,0x10);
    }
  }
  QUrlModel::addUrls(this->urlModel,(QList<QUrl> *)&local_78,0,true);
  pQVar7 = QComboBox::model(&this->super_QComboBox);
  pQVar8 = QComboBox::model(&this->super_QComboBox);
  local_b8.d = (Data *)0xffffffffffffffff;
  local_b8.ptr = (QUrl *)0x0;
  local_b8.size = 0;
  iVar4 = (**(code **)(*(long *)pQVar8 + 0x78))(pQVar8,&local_b8);
  local_d0.d = (QUrlPrivate *)0xffffffffffffffff;
  local_c8 = 0;
  uStack_c0 = 0;
  (**(code **)(*(long *)pQVar7 + 0x60))(&local_58,pQVar7,iVar4 + -1,0);
  local_88 = (long *)local_58._16_8_;
  local_98 = (QArrayData *)local_58.shared;
  pcStack_90 = (char16_t *)local_58._8_8_;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QUrl *)0x0;
  local_b8.size = 0;
  if ((this->m_history).d.size != 0) {
    uVar12 = 0;
    do {
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::fromLocalFile((QString *)local_58.data);
      pQVar2 = local_b8.ptr;
      if (local_b8.size == 0) {
LAB_004ec995:
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
                  ((QMovableArrayOps<QUrl> *)&local_b8,0,(QUrl *)&local_58.shared);
      }
      else {
        lVar13 = local_b8.size << 3;
        lVar11 = 0;
        do {
          if (lVar13 == lVar11) goto LAB_004ec995;
          cVar3 = comparesEqual((QUrl *)((long)&pQVar2->d + lVar11),(QUrl *)&local_58.shared);
          lVar11 = lVar11 + 8;
        } while (cVar3 == '\0');
        if ((long)local_b8.ptr - (long)pQVar2 == lVar11) goto LAB_004ec995;
      }
      QUrl::~QUrl((QUrl *)&local_58.shared);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(this->m_history).d.size);
    if (local_b8.size != 0) {
      pQVar7 = QComboBox::model(&this->super_QComboBox);
      pQVar8 = QComboBox::model(&this->super_QComboBox);
      local_58._forAlignment = -NAN;
      local_58._8_8_ = (char16_t *)0x0;
      local_58._16_8_ = (long *)0x0;
      uVar5 = (**(code **)(*(long *)pQVar8 + 0x78))(pQVar8);
      local_d0.d = (QUrlPrivate *)0xffffffffffffffff;
      local_c8 = 0;
      uStack_c0 = 0;
      (**(code **)(*(long *)pQVar7 + 0xf8))(pQVar7,uVar5,1,&local_d0);
      pQVar7 = QComboBox::model(&this->super_QComboBox);
      pQVar8 = QComboBox::model(&this->super_QComboBox);
      local_d0.d = (QUrlPrivate *)0xffffffffffffffff;
      local_c8 = 0;
      uStack_c0 = 0;
      iVar4 = (**(code **)(*(long *)pQVar8 + 0x78))(pQVar8,&local_d0);
      (**(code **)(*(long *)pQVar7 + 0x60))(&local_58,pQVar7,iVar4 + -1,0);
      local_88 = (long *)local_58._16_8_;
      local_98 = (QArrayData *)local_58.shared;
      pcStack_90 = (char16_t *)local_58._8_8_;
      pQVar7 = QComboBox::model(&this->super_QComboBox);
      QMetaObject::tr((char *)&local_d0,(char *)&QFileDialog::staticMetaObject,0x6e5c98);
      ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_d0);
      (**(code **)(*(long *)pQVar7 + 0x98))(pQVar7,&local_98,&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      if ((QArrayData *)local_d0.d != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_d0.d = *(int *)local_d0.d + -1;
        UNLOCK();
        if (*(int *)local_d0.d == 0) {
          QArrayData::deallocate((QArrayData *)local_d0.d,2,0x10);
        }
      }
      QComboBox::model(&this->super_QComboBox);
      plVar9 = (long *)QMetaObject::cast((QObject *)&QStandardItemModel::staticMetaObject);
      if (plVar9 != (long *)0x0) {
        uVar6 = (**(code **)(*plVar9 + 0x138))(plVar9,&local_98);
        uVar10 = QStandardItemModel::item((int)plVar9,(uint)local_98);
        QStandardItem::setFlags(uVar10,uVar6 & 0xffffffdf);
      }
      QUrlModel::addUrls(this->urlModel,(QList<QUrl> *)&local_b8,-1,false);
    }
  }
  QComboBox::setCurrentIndex(&this->super_QComboBox,0);
  QComboBox::showPopup(&this->super_QComboBox);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogComboBox::showPopup()
{
    if (model()->rowCount() > 1)
        QComboBox::showPopup();

    urlModel->setUrls(QList<QUrl>());
    QList<QUrl> list;
    QModelIndex idx = d_ptr->model->index(d_ptr->rootPath());
    while (idx.isValid()) {
        QUrl url = QUrl::fromLocalFile(idx.data(QFileSystemModel::FilePathRole).toString());
        if (url.isValid())
            list.append(url);
        idx = idx.parent();
    }
    // add "my computer"
    list.append(QUrl("file:"_L1));
    urlModel->addUrls(list, 0);
    idx = model()->index(model()->rowCount() - 1, 0);

    // append history
    QList<QUrl> urls;
    for (int i = 0; i < m_history.size(); ++i) {
        QUrl path = QUrl::fromLocalFile(m_history.at(i));
        if (!urls.contains(path))
            urls.prepend(path);
    }
    if (urls.size() > 0) {
        model()->insertRow(model()->rowCount());
        idx = model()->index(model()->rowCount()-1, 0);
        // ### TODO maybe add a horizontal line before this
        model()->setData(idx, QFileDialog::tr("Recent Places"));
        QStandardItemModel *m = qobject_cast<QStandardItemModel*>(model());
        if (m) {
            Qt::ItemFlags flags = m->flags(idx);
            flags &= ~Qt::ItemIsEnabled;
            m->item(idx.row(), idx.column())->setFlags(flags);
        }
        urlModel->addUrls(urls, -1, false);
    }
    setCurrentIndex(0);

    QComboBox::showPopup();
}